

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.cpp
# Opt level: O1

void __thiscall CharScanner::matchRange(CharScanner *this,int c1,int c2)

{
  int iVar1;
  ScannerException *this_00;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  iVar1 = (*(this->super_TokenStream)._vptr_TokenStream[0x12])(this,1);
  if ((c1 <= iVar1) &&
     (iVar1 = (*(this->super_TokenStream)._vptr_TokenStream[0x12])(this,1), iVar1 <= c2)) {
    (*(this->super_TokenStream)._vptr_TokenStream[6])(this);
    return;
  }
  this_00 = (ScannerException *)__cxa_allocate_exception(0x38);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"char out of range: \'","");
  iVar1 = (*(this->super_TokenStream)._vptr_TokenStream[0x12])(this,1);
  if (iVar1 != -1) {
    charName::buf[0] = (char)iVar1;
    charName::buf[1] = '\0';
  }
  plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
  local_90 = (long *)*plVar2;
  plVar3 = plVar2 + 2;
  if (local_90 == plVar3) {
    local_80 = *plVar3;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar3;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_70._M_dataplus._M_p = (pointer)*plVar2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_70._M_dataplus._M_p == psVar4) {
    local_70.field_2._M_allocated_capacity = *psVar4;
    local_70.field_2._8_8_ = plVar2[3];
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar4;
  }
  local_70._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  ScannerException::ScannerException(this_00,&local_70,((this->inputState).ref)->ptr->line);
  __cxa_throw(this_00,&ScannerException::typeinfo,ANTLRException::~ANTLRException);
}

Assistant:

void CharScanner::matchRange(int c1, int c2)
{
	if (LA(1)<c1 || LA(1)>c2) {
		throw ScannerException(std::string("char out of range: '") + charName(LA(1)) + "'", inputState->line);
	}
	consume();
}